

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O1

bool ProcessArray<aiVector3t<float>>
               (aiVector3t<float> **in,uint num,char *name,
               vector<bool,_std::allocator<bool>_> *dirtyMask,bool mayBeIdentical,bool mayBeZero)

{
  float fVar1;
  float fVar2;
  float fVar3;
  _Bit_type *p_Var4;
  Logger *this;
  ostream *this_00;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  char *pcVar8;
  aiVector3t<float> *paVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  _IEEESingle temp;
  _IEEESingle temp_1;
  _IEEESingle temp_2;
  char *err;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char local_1b8 [16];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar8 = (char *)CONCAT44(in_register_00000034,num);
  uVar6 = 0;
  bVar12 = num != 0;
  if (num == 0) {
    bVar13 = true;
    bVar5 = false;
  }
  else {
    paVar9 = *in;
    p_Var4 = (dirtyMask->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    bVar12 = true;
    uVar7 = 0;
    bVar5 = false;
    do {
      if ((((long)(dirtyMask->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var4) *
           8 == -(ulong)(dirtyMask->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) ||
         ((p_Var4[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0)) {
        fVar1 = paVar9->x;
        if (((uint)ABS(fVar1) < 0x7f800000) &&
           ((fVar2 = paVar9->y, (uint)ABS(fVar2) < 0x7f800000 &&
            (fVar3 = paVar9->z, (uint)ABS(fVar3) < 0x7f800000)))) {
          if (((((mayBeZero) || (fVar1 != 0.0)) || (NAN(fVar1))) || ((fVar2 != 0.0 || (NAN(fVar2))))
              ) || ((fVar3 != 0.0 || (NAN(fVar3))))) {
            bVar13 = true;
            if (uVar7 != 0) {
              if ((fVar1 == paVar9[-1].x) && (!NAN(fVar1) && !NAN(paVar9[-1].x))) {
                bVar13 = true;
                if ((fVar2 == paVar9[-1].y) && (!NAN(fVar2) && !NAN(paVar9[-1].y))) {
                  if (fVar3 != paVar9[-1].z) {
                    bVar5 = true;
                  }
                  if (NAN(fVar3) || NAN(paVar9[-1].z)) {
                    bVar5 = true;
                  }
                  goto LAB_00152fb9;
                }
              }
              bVar13 = true;
              bVar5 = true;
            }
          }
          else {
            bVar13 = false;
            pcVar8 = "Found zero-length vector";
          }
        }
        else {
          bVar13 = false;
          pcVar8 = "INF/NAN was found in a vector component";
        }
LAB_00152fb9:
        uVar6 = uVar6 + 1;
        if (!bVar13) break;
      }
      uVar7 = uVar7 + 1;
      bVar12 = uVar7 < num;
      paVar9 = paVar9 + 1;
    } while (num != uVar7);
    bVar13 = uVar6 < 2;
  }
  pcVar10 = (char *)0x0;
  pcVar11 = "All vectors are identical";
  if (mayBeIdentical) {
    pcVar11 = pcVar10;
  }
  if (bVar5) {
    pcVar11 = pcVar10;
  }
  if (bVar13) {
    pcVar11 = pcVar10;
  }
  if (bVar12) {
    pcVar11 = pcVar8;
  }
  if (pcVar11 != (char *)0x0) {
    local_1d8 = pcVar11;
    local_1d0 = name;
    this = Assimp::DefaultLogger::get();
    Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[38]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [38])"FindInvalidDataProcess fails on mesh ");
    this_00 = (ostream *)
              Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(local_1a8,&local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,": ",2);
    Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)this_00,
               &local_1d8);
    std::__cxx11::stringbuf::str();
    Assimp::Logger::error(this,local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (*in != (aiVector3t<float> *)0x0) {
      operator_delete__(*in);
    }
    *in = (aiVector3t<float> *)0x0;
  }
  return pcVar11 != (char *)0x0;
}

Assistant:

inline 
bool ProcessArray(T*& in, unsigned int num,const char* name,
        const std::vector<bool>& dirtyMask, bool mayBeIdentical = false, bool mayBeZero = true) {
    const char* err = ValidateArrayContents(in,num,dirtyMask,mayBeIdentical,mayBeZero);
    if (err)    {
        ASSIMP_LOG_ERROR_F( "FindInvalidDataProcess fails on mesh ", name, ": ", err);
        delete[] in;
        in = NULL;
        return true;
    }
    return false;
}